

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSeparation.cpp
# Opt level: O1

void __thiscall HighsSeparation::separate(HighsSeparation *this,HighsDomain *propdomain)

{
  HighsLpRelaxation *pHVar1;
  HighsMipSolver *pHVar2;
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var3;
  HighsInt HVar4;
  long lVar5;
  double dVar6;
  Status status;
  double lastobj;
  Status local_3c;
  double local_38;
  double local_30;
  
  pHVar1 = this->lp;
  local_3c = pHVar1->status;
  pHVar2 = pHVar1->mipsolver;
  if (((kUnscaledInfeasible < local_3c) || ((0x3aU >> (local_3c & 0x1f) & 1) == 0)) ||
     ((pHVar1->fractionalints).
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (pHVar1->fractionalints).
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    HighsLpRelaxation::performAging(pHVar1,true);
    HighsCutPool::performAging
              (&((pHVar2->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->cutpool);
    return;
  }
  local_38 = ((pHVar2->mipdata_)._M_t.
              super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
              _M_t.
              super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
              .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->rootlpsolobj;
  do {
    local_30 = this->lp->objective;
    if (((pHVar2->mipdata_)._M_t.
         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
         super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->optimality_limit <=
        local_30) {
      return;
    }
    lVar5 = this->lp->numlpiters;
    HVar4 = separationRound(this,propdomain,&local_3c);
    pHVar1 = this->lp;
    lVar5 = pHVar1->numlpiters - lVar5;
    _Var3._M_head_impl =
         (pHVar2->mipdata_)._M_t.
         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
         super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    (_Var3._M_head_impl)->sepa_lp_iterations = (_Var3._M_head_impl)->sepa_lp_iterations + lVar5;
    (_Var3._M_head_impl)->total_lp_iterations = (_Var3._M_head_impl)->total_lp_iterations + lVar5;
    if (HVar4 == 0) {
      return;
    }
    if ((2 < local_3c - kUnscaledDualFeasible) && (local_3c != kOptimal)) {
      return;
    }
    if ((pHVar1->fractionalints).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start ==
        (pHVar1->fractionalints).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      return;
    }
    dVar6 = (_Var3._M_head_impl)->feastol;
    if ((_Var3._M_head_impl)->feastol <= local_30 - local_38) {
      dVar6 = local_30 - local_38;
    }
  } while (dVar6 * 1.01 < pHVar1->objective - local_38);
  return;
}

Assistant:

void HighsSeparation::separate(HighsDomain& propdomain) {
  HighsLpRelaxation::Status status = lp->getStatus();
  const HighsMipSolver& mipsolver = lp->getMipSolver();

  if (lp->scaledOptimal(status) && !lp->getFractionalIntegers().empty()) {
    // double firstobj = lp->getObjective();
    double firstobj = mipsolver.mipdata_->rootlpsolobj;

    while (lp->getObjective() < mipsolver.mipdata_->optimality_limit) {
      double lastobj = lp->getObjective();

      size_t nlpiters = -lp->getNumLpIterations();
      HighsInt ncuts = separationRound(propdomain, status);
      nlpiters += lp->getNumLpIterations();
      mipsolver.mipdata_->sepa_lp_iterations += nlpiters;
      mipsolver.mipdata_->total_lp_iterations += nlpiters;
      // printf("separated %" HIGHSINT_FORMAT " cuts\n", ncuts);

      // printf(
      //     "separation round %" HIGHSINT_FORMAT " at node %" HIGHSINT_FORMAT "
      //     added %" HIGHSINT_FORMAT " cuts objective changed " "from %g to %g,
      //     first obj is %g\n", nrounds, (HighsInt)nnodes, ncuts, lastobj,
      //     lp->getObjective(), firstobj);
      if (ncuts == 0 || !lp->scaledOptimal(status) ||
          lp->getFractionalIntegers().empty())
        break;

      // if the objective improved considerably we continue
      if ((lp->getObjective() - firstobj) <=
          std::max((lastobj - firstobj), mipsolver.mipdata_->feastol) * 1.01)
        break;
    }

    // printf("done separating\n");
  } else {
    // printf("no separation, just aging. status: %" HIGHSINT_FORMAT "\n",
    //        (HighsInt)status);
    lp->performAging(true);
    mipsolver.mipdata_->cutpool.performAging();
  }
}